

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

Generator * __thiscall kratos::Context::generator(Context *this,string *name)

{
  _Rb_tree<std::shared_ptr<kratos::Generator>,std::shared_ptr<kratos::Generator>,std::_Identity<std::shared_ptr<kratos::Generator>>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
  *this_00;
  Context *local_38;
  shared_ptr<kratos::Generator> local_30;
  undefined1 local_19;
  
  local_38 = this;
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::Generator>,kratos::Context*,std::__cxx11::string_const&>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (allocator<kratos::Generator> *)&local_19,&local_38,name);
  this_00 = (_Rb_tree<std::shared_ptr<kratos::Generator>,std::shared_ptr<kratos::Generator>,std::_Identity<std::shared_ptr<kratos::Generator>>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
             *)std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,name);
  std::
  _Rb_tree<std::shared_ptr<kratos::Generator>,std::shared_ptr<kratos::Generator>,std::_Identity<std::shared_ptr<kratos::Generator>>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>
  ::_M_emplace_unique<std::shared_ptr<kratos::Generator>const&>(this_00,&local_30);
  if (local_30.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return local_30.super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

Generator &Context::generator(const std::string &name) {
    auto const &p = std::make_shared<Generator>(this, name);
    modules_[name].emplace(p);
    return *p;
}